

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlShellPwd(xmlShellCtxtPtr ctxt,char *buffer,xmlNodePtr node,xmlNodePtr node2)

{
  xmlChar *pxVar1;
  int iVar2;
  
  iVar2 = -1;
  if (buffer != (char *)0x0 && node != (xmlNodePtr)0x0) {
    pxVar1 = xmlGetNodePath(node);
    if (pxVar1 != (xmlChar *)0x0) {
      iVar2 = 0;
      snprintf(buffer,499,"%s",pxVar1);
      buffer[499] = '0';
      (*xmlFree)(pxVar1);
    }
  }
  return iVar2;
}

Assistant:

int
xmlShellPwd(xmlShellCtxtPtr ctxt ATTRIBUTE_UNUSED, char *buffer,
            xmlNodePtr node, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlChar *path;

    if ((node == NULL) || (buffer == NULL))
        return (-1);

    path = xmlGetNodePath(node);
    if (path == NULL)
	return (-1);

    /*
     * This test prevents buffer overflow, because this routine
     * is only called by xmlShell, in which the second argument is
     * 500 chars long.
     * It is a dirty hack before a cleaner solution is found.
     * Documentation should mention that the second argument must
     * be at least 500 chars long, and could be stripped if too long.
     */
    snprintf(buffer, 499, "%s", path);
    buffer[499] = '0';
    xmlFree(path);

    return (0);
}